

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

opj_bool opj_stream_write_seek
                   (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  opj_bool oVar1;
  int iVar2;
  opj_event_mgr_t *in_RDX;
  opj_stream_private_t *in_RSI;
  undefined8 *in_RDI;
  opj_bool local_4;
  
  oVar1 = opj_stream_flush(in_RSI,in_RDX);
  if (oVar1 == 0) {
    *(uint *)((long)in_RDI + 100) = *(uint *)((long)in_RDI + 100) | 8;
    local_4 = 1;
  }
  else {
    in_RDI[7] = in_RDI[6];
    *(undefined4 *)(in_RDI + 10) = 0;
    iVar2 = (*(code *)in_RDI[5])(in_RSI,*in_RDI);
    if (iVar2 == 0) {
      *(uint *)((long)in_RDI + 100) = *(uint *)((long)in_RDI + 100) | 8;
      local_4 = 1;
    }
    else {
      in_RDI[0xb] = in_RSI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

opj_bool opj_stream_write_seek (opj_stream_private_t * p_stream, OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
	if
		(! opj_stream_flush(p_stream,p_event_mgr))
	{
		p_stream->m_status |= opj_stream_e_error;
		return EXIT_FAILURE;
	}

	p_stream->m_current_data = p_stream->m_stored_data;
	p_stream->m_bytes_in_buffer = 0;

	if
		(! p_stream->m_seek_fn(p_size,p_stream->m_user_data))
	{
		p_stream->m_status |= opj_stream_e_error;
		return EXIT_FAILURE;
	}
	else
	{
		p_stream->m_byte_offset = p_size;
	}
	return EXIT_SUCCESS;
}